

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

int http1_on_header(http1_parser_s *parser,char *name,size_t name_len,char *data,size_t data_len)

{
  size_t sVar1;
  FIOBJ name_00;
  FIOBJ value;
  FIOBJ obj;
  FIOBJ sym;
  size_t data_len_local;
  char *data_local;
  size_t name_len_local;
  char *name_local;
  http1_parser_s *parser_local;
  
  if (parser[3].state.content_length == 0) {
    if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("ERROR: (http1 parse ordering error) missing HashMap for header %s: %s",name,
                     data);
    }
    http_send_error2(500,(intptr_t)parser[-1].state.next,
                     *(http_settings_s **)&parser[-1].state.reserved);
    parser_local._4_4_ = -1;
  }
  else {
    parser[4].state.next = parser[4].state.next + name_len + data_len;
    if ((parser[4].state.next < (uint8_t *)parser[4].state.read) &&
       (sVar1 = fiobj_hash_count(parser[3].state.content_length), sVar1 < 0x81)) {
      name_00 = fiobj_str_new(name,name_len);
      value = fiobj_str_new(data,data_len);
      set_header_add(parser[3].state.content_length,name_00,value);
      fiobj_free(name_00);
      parser_local._4_4_ = 0;
    }
    else {
      if ((*(char *)(*(long *)&parser[-1].state.reserved + 0x7a) != '\0') && (2 < FIO_LOG_LEVEL)) {
        FIO_LOG2STDERR("WARNING: (HTTP) security alert - header flood detected.");
      }
      http_send_error((http_s *)(parser + 1),0x19d);
      parser_local._4_4_ = -1;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static int http1_on_header(http1_parser_s *parser, char *name, size_t name_len,
                           char *data, size_t data_len) {
  FIOBJ sym;
  FIOBJ obj;
  if (!http1_pr2handle(parser2http(parser)).headers) {
    FIO_LOG_ERROR("(http1 parse ordering error) missing HashMap for header "
                  "%s: %s",
                  name, data);
    http_send_error2(500, parser2http(parser)->p.uuid,
                     parser2http(parser)->p.settings);
    return -1;
  }
  parser2http(parser)->header_size += name_len + data_len;
  if (parser2http(parser)->header_size >=
          parser2http(parser)->max_header_size ||
      fiobj_hash_count(http1_pr2handle(parser2http(parser)).headers) >
          HTTP_MAX_HEADER_COUNT) {
    if (parser2http(parser)->p.settings->log) {
      FIO_LOG_WARNING("(HTTP) security alert - header flood detected.");
    }
    http_send_error(&http1_pr2handle(parser2http(parser)), 413);
    return -1;
  }
  sym = fiobj_str_new(name, name_len);
  obj = fiobj_str_new(data, data_len);
  set_header_add(http1_pr2handle(parser2http(parser)).headers, sym, obj);
  fiobj_free(sym);
  return 0;
}